

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  undefined4 *in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  ImVec2 *local_50;
  int local_44;
  int local_40;
  int local_3c;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  int local_20;
  ImVec2 local_10 [2];
  
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 2));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x18));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x3a));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x363));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0xd94));
  local_50 = (ImVec2 *)(in_RDI + 0xd96);
  do {
    ImVec2::ImVec2(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != (ImVec2 *)(in_RDI + 0xda0));
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)(in_RDI + 0xdf0));
  memset(in_RDI,0,0x37d0);
  *in_RDI = 0;
  in_RDI[1] = 0;
  ImVec2::ImVec2(local_10,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 2) = local_10[0];
  in_RDI[4] = 0x3c888889;
  in_RDI[5] = 0x40a00000;
  *(char **)(in_RDI + 6) = "imgui.ini";
  *(char **)(in_RDI + 8) = "imgui_log.txt";
  in_RDI[10] = 0x3e99999a;
  in_RDI[0xb] = 0x40c00000;
  for (local_20 = 0; local_20 < 0x285; local_20 = local_20 + 1) {
    in_RDI[(long)local_20 + 0x3c] = 0xffffffff;
  }
  in_RDI[0xd] = 0x3e8ccccd;
  in_RDI[0xe] = 0x3d4ccccd;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x12) = 0;
  in_RDI[0x14] = 0x3f800000;
  *(undefined8 *)(in_RDI + 0x16) = 0;
  *(undefined1 *)(in_RDI + 0x15) = 0;
  ImVec2::ImVec2(&local_28,1.0,1.0);
  *(ImVec2 *)(in_RDI + 0x18) = local_28;
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  *(undefined1 *)((long)in_RDI + 0x69) = 0;
  *(undefined1 *)((long)in_RDI + 0x6a) = 1;
  *(undefined1 *)((long)in_RDI + 0x6b) = 1;
  *(undefined1 *)((long)in_RDI + 0x6d) = 1;
  *(undefined1 *)((long)in_RDI + 0x6e) = 0;
  in_RDI[0x1c] = 0x42700000;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x1e) = 0;
  *(undefined8 *)(in_RDI + 0x26) = 0;
  *(undefined8 *)(in_RDI + 0x24) = 0;
  *(undefined8 *)(in_RDI + 0x22) = 0;
  *(code **)(in_RDI + 0x28) = GetClipboardTextFn_DefaultImpl;
  *(code **)(in_RDI + 0x2a) = SetClipboardTextFn_DefaultImpl;
  *(undefined8 *)(in_RDI + 0x2c) = 0;
  *(code **)(in_RDI + 0x2e) = SetPlatformImeDataFn_DefaultImpl;
  ImVec2::ImVec2(&local_30,-3.4028235e+38,-3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0x363) = local_30;
  ImVec2::ImVec2(&local_38,-3.4028235e+38,-3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0xd94) = local_38;
  in_RDI[0xc] = 0x40c00000;
  for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
    in_RDI[(long)local_3c + 0xdbb] = 0xbf800000;
    in_RDI[(long)local_3c + 0xdb6] = 0xbf800000;
  }
  for (local_40 = 0; local_40 < 0x285; local_40 = local_40 + 1) {
    in_RDI[(long)local_40 * 4 + 0x381] = 0xbf800000;
    in_RDI[(long)local_40 * 4 + 0x380] = 0xbf800000;
  }
  for (local_44 = 0; local_44 < 0x14; local_44 = local_44 + 1) {
    in_RDI[(long)local_44 + 0xdc5] = 0xbf800000;
  }
  *(undefined1 *)((long)in_RDI + 0x37b9) = 0xff;
  *(undefined1 *)((long)in_RDI + 0x37ba) = 1;
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));
    IM_STATIC_ASSERT(IM_ARRAYSIZE(ImGuiIO::MouseDown) == ImGuiMouseButton_COUNT && IM_ARRAYSIZE(ImGuiIO::MouseClicked) == ImGuiMouseButton_COUNT);

    // Settings
    ConfigFlags = ImGuiConfigFlags_None;
    BackendFlags = ImGuiBackendFlags_None;
    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f / 60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini"; // Important: "imgui.ini" is relative to current working dir, most apps will want to lock this to an absolute path (e.g. same path as executables).
    LogFilename = "imgui_log.txt";
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
#endif
    KeyRepeatDelay = 0.275f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    Fonts = NULL;
    FontGlobalScale = 1.0f;
    FontDefault = NULL;
    FontAllowUserScaling = false;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);

    // Miscellaneous options
    MouseDrawCursor = false;
#ifdef __APPLE__
    ConfigMacOSXBehaviors = true;  // Set Mac OS X style defaults based on __APPLE__ compile time flag
#else
    ConfigMacOSXBehaviors = false;
#endif
    ConfigInputTrickleEventQueue = true;
    ConfigInputTextCursorBlink = true;
    ConfigWindowsResizeFromEdges = true;
    ConfigWindowsMoveFromTitleBarOnly = false;
    ConfigMemoryCompactTimer = 60.0f;

    // Platform Functions
    BackendPlatformName = BackendRendererName = NULL;
    BackendPlatformUserData = BackendRendererUserData = BackendLanguageUserData = NULL;
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ClipboardUserData = NULL;
    SetPlatformImeDataFn = SetPlatformImeDataFn_DefaultImpl;

    // Input (NB: we already have memset zero the entire structure!)
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    MousePosPrev = ImVec2(-FLT_MAX, -FLT_MAX);
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++) MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysData); i++) { KeysData[i].DownDuration = KeysData[i].DownDurationPrev = -1.0f; }
    for (int i = 0; i < IM_ARRAYSIZE(NavInputsDownDuration); i++) NavInputsDownDuration[i] = -1.0f;
    BackendUsingLegacyKeyArrays = (ImS8)-1;
    BackendUsingLegacyNavInputArray = true; // assume using legacy array until proven wrong
}